

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  size_type sVar1;
  FileDescriptor *local_30;
  FileDescriptor *file;
  string *psStack_20;
  bool build_it_local;
  string *name_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  file._7_1_ = build_it;
  psStack_20 = name;
  name_local = (string *)this;
  this_local = (DescriptorBuilder *)FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it)
  ;
  local_30 = Symbol::GetFile((Symbol *)&this_local);
  if ((local_30 != this->file_) &&
     (sVar1 = std::
              set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::count(&this->dependencies_,&local_30), sVar1 == 0)) {
    return (Symbol)(SymbolBase *)this_local;
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::erase(&this->unused_dependency_,&local_30);
  return (Symbol)(SymbolBase *)this_local;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}